

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  nn_trie_node *pnVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  nn_trie_node **self_00;
  nn_trie_node *pnVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  long *plVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  
  pnVar10 = *self;
  if (size == 0) {
    if (pnVar10 == (nn_trie_node *)0x0) {
      return -0x16;
    }
  }
  else {
    uVar7 = nn_node_check_prefix(pnVar10,data,size);
    uVar13 = (ulong)pnVar10->prefix_len;
    if (uVar7 != pnVar10->prefix_len) {
      return 0;
    }
    if (uVar13 != size) {
      pbVar16 = data + uVar13;
      self_00 = nn_node_next(pnVar10,*pbVar16);
      if (self_00 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar8 = nn_node_unsubscribe(self_00,pbVar16 + 1,~uVar13 + size);
      if (iVar8 == 0) {
        return 0;
      }
      if (*self_00 != (nn_trie_node *)0x0) {
        return 1;
      }
      pnVar10 = *self;
      uVar13 = (ulong)pnVar10->type;
      if (8 < uVar13) {
        uVar3 = (pnVar10->u).dense.nbr;
        if (uVar3 < 10) {
          pnVar10 = (nn_trie_node *)nn_alloc_(0x58);
          if (pnVar10 == (nn_trie_node *)0x0) {
            __assert_fail("new_node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                          ,0x260,
                          "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)"
                         );
          }
          pnVar10->refcount = 0;
          pnVar4 = *self;
          bVar6 = pnVar4->prefix_len;
          pnVar10->prefix_len = bVar6;
          memcpy(pnVar10->prefix,pnVar4->prefix,(ulong)bVar6);
          pnVar10->type = '\b';
          uVar13 = 0;
          iVar8 = 0;
          while( true ) {
            pnVar4 = *self;
            bVar6 = (pnVar4->u).sparse.children[0];
            if (uVar13 == ((uint)(pnVar4->u).sparse.children[1] - (uint)bVar6) + 1) break;
            lVar5 = *(long *)(pnVar4[1].prefix + uVar13 * 8 + -6);
            if (lVar5 != 0) {
              pnVar10->prefix[(long)iVar8 + 10] = bVar6 + (char)uVar13;
              *(long *)(pnVar10[1].prefix + (long)iVar8 * 8 + -6) = lVar5;
              iVar8 = iVar8 + 1;
            }
            uVar13 = uVar13 + 1;
          }
          if (iVar8 == 8) {
            nn_free(pnVar4);
            *self = pnVar10;
            return 1;
          }
          __assert_fail("j == NN_TRIE_SPARSE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x26f,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        bVar6 = *pbVar16;
        bVar2 = (pnVar10->u).sparse.children[0];
        uVar7 = (uint)bVar2;
        if (bVar6 == bVar2) {
          uVar12 = (uint)(pnVar10->u).sparse.children[1];
          pnVar10 = pnVar10 + 1;
          uVar15 = (uVar12 - uVar7) + 1;
          uVar13 = (ulong)uVar15;
          uVar17 = 0;
          do {
            if (uVar13 == uVar17) {
LAB_0011b08e:
              iVar8 = uVar15 + uVar7;
              memmove(pnVar10,pnVar10->prefix + uVar13 * 8 + -6,
                      (long)(int)((uVar12 - iVar8) + 1) << 3);
              ((*self)->u).sparse.children[0] = (uint8_t)iVar8;
              puVar1 = &((*self)->u).dense.nbr;
              *puVar1 = *puVar1 - 1;
              pnVar10 = (nn_trie_node *)
                        nn_realloc(*self,(long)(int)(((uint)((*self)->u).sparse.children[1] - iVar8)
                                                    + 1) * 8 + 0x18);
              *self = pnVar10;
              if (pnVar10 == (nn_trie_node *)0x0) {
                __assert_fail("*self",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                              ,0x244,
                              "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)"
                             );
              }
              return 1;
            }
            if (*(long *)(pnVar10->prefix + uVar17 * 8 + -6) != 0) {
              uVar15 = (uint)uVar17;
              uVar13 = uVar17;
              goto LAB_0011b08e;
            }
            uVar17 = uVar17 + 1;
          } while( true );
        }
        if (bVar6 != (pnVar10->u).sparse.children[1]) {
          (pnVar10->u).dense.nbr = uVar3 - 1;
          return 1;
        }
        uVar13 = (ulong)uVar7;
        plVar14 = (long *)((long)pnVar10 + ((ulong)bVar6 * 8 - (ulong)((uint)bVar2 * 8)) + 0x18);
        do {
          if (bVar6 == uVar13) {
            cVar11 = '\0';
LAB_0011b103:
            (pnVar10->u).sparse.children[1] = bVar2 + cVar11;
            puVar1 = &((*self)->u).dense.nbr;
            *puVar1 = *puVar1 - 1;
            pnVar10 = *self;
            pnVar10 = (nn_trie_node *)
                      nn_realloc(pnVar10,((ulong)(pnVar10->u).sparse.children[1] -
                                         (ulong)(pnVar10->u).sparse.children[0]) * 8 + 0x20);
            *self = pnVar10;
            if (pnVar10 == (nn_trie_node *)0x0) {
              __assert_fail("*self",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                            ,0x253,
                            "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)"
                           );
            }
            return 1;
          }
          if (*plVar14 != 0) {
            cVar11 = bVar6 - (char)uVar13;
            goto LAB_0011b103;
          }
          uVar13 = uVar13 + 1;
          plVar14 = plVar14 + -1;
        } while( true );
      }
      uVar17 = 0;
      while( true ) {
        if (uVar13 == uVar17) {
          __assert_fail("index != (*self)->type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x210,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        if (pnVar10->prefix[uVar17 + 10] == *pbVar16) break;
        uVar17 = uVar17 + 1;
      }
      memmove(pnVar10->prefix + uVar17 + 10,pnVar10->prefix + uVar17 + 0xb,~uVar17 + uVar13);
      pnVar10 = *self;
      memmove(pnVar10[1].prefix + uVar17 * 8 + -6,pnVar10[1].prefix + uVar17 * 8 + 2,
              (long)(int)(~(uint)uVar17 + (uint)pnVar10->type) << 3);
      pnVar10 = *self;
      bVar6 = pnVar10->type - 1;
      pnVar10->type = bVar6;
      pnVar10 = (nn_trie_node *)nn_realloc(pnVar10,(ulong)bVar6 * 8 + 0x18);
      *self = pnVar10;
      if (pnVar10 == (nn_trie_node *)0x0) {
        __assert_fail("*self",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x21e,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      if ((pnVar10->type == '\0') && (pnVar10->refcount == 0)) goto LAB_0011aeca;
      goto LAB_0011aeb9;
    }
  }
  if (pnVar10->refcount == 0) {
    return -0x16;
  }
  uVar9 = pnVar10->refcount - 1;
  pnVar10->refcount = uVar9;
  if (uVar9 != 0) {
    return 0;
  }
  if (pnVar10->type == '\0') {
LAB_0011aeca:
    nn_free(pnVar10);
    *self = (nn_trie_node *)0x0;
    return 1;
  }
LAB_0011aeb9:
  pnVar10 = nn_node_compact(pnVar10);
  *self = pnVar10;
  return 1;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}